

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::QueuedPipeline::getPipelinedCap(QueuedPipeline *this,Array<capnp::PipelineOp> *ops)

{
  undefined8 *puVar1;
  ArrayDisposer **this_00;
  long lVar2;
  PromiseArena *pPVar3;
  void *pvVar4;
  long *in_RDX;
  ClientHook *extraout_RDX;
  long lVar5;
  ClientHook *extraout_RDX_00;
  ClientHook *pCVar6;
  long lVar7;
  PromiseBase location;
  Entry *pEVar8;
  Own<capnp::ClientHook,_std::nullptr_t> OVar9;
  ArrayPtr<kj::HashMap<kj::Array<capnp::PipelineOp>,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Entry>
  table;
  bool success;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_f8;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_c__:501:17),_kj::Own<capnp::PipelineHook>_>
  clientPromise;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_e8;
  Array<capnp::PipelineOp> result;
  void *continuationTracePtr;
  QueuedClient *pQStack_c0;
  PipelineOp *local_b8;
  ArrayDisposer *local_b0;
  size_t pos;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:615:7)>
  local_98;
  Entry local_70;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_48;
  ArrayPtr<capnp::PipelineOp> local_40;
  
  if (ops[2].ptr == (PipelineOp *)0x0) {
    this_00 = &ops[2].disposer;
    local_40.ptr = (PipelineOp *)*in_RDX;
    local_40.size_ = in_RDX[1];
    pos = ((long)ops[3].ptr - (long)ops[2].disposer) / 0x28;
    table.size_ = (size_t)ops[2].disposer;
    table.ptr = (Entry *)(ops + 4);
    kj::
    HashIndex<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Callbacks>
    ::
    insert<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Entry,kj::ArrayPtr<capnp::PipelineOp>&>
              ((HashIndex<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Callbacks>
                *)&local_98,table,pos,(ArrayPtr<capnp::PipelineOp> *)pos);
    if ((HashIndex<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Callbacks>
         )local_98.maybeFunc.ptr.isSet ==
        (HashIndex<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Callbacks>
         )0x1) {
      pEVar8 = (Entry *)(*this_00 + (long)local_98.maybeFunc.ptr.field_1.value.success * 0x28);
    }
    else {
      local_98.maybeFunc.ptr.field_1.value.success = &success;
      success = false;
      local_98.maybeFunc.ptr.isSet = true;
      local_98.maybeFunc.ptr.field_1.value.pos = &pos;
      local_98.maybeFunc.ptr.field_1.value.table =
           (Table<kj::HashMap<kj::Array<capnp::PipelineOp>,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Entry,_kj::HashIndex<kj::HashMap<kj::Array<capnp::PipelineOp>,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Callbacks>_>
            *)this_00;
      local_98.maybeFunc.ptr.field_1.value.params = &local_40;
      kj::ForkedPromise<kj::Own<capnp::PipelineHook,_std::nullptr_t>_>::addBranch
                ((ForkedPromise<kj::Own<capnp::PipelineHook,_std::nullptr_t>_> *)
                 &stack0xffffffffffffff08);
      result.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<capnp::PipelineOp>(in_RDX[1]);
      local_b0 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      lVar2 = *in_RDX;
      lVar7 = lVar2;
      for (lVar5 = 0; puVar1 = (undefined8 *)(lVar2 + lVar5),
          puVar1 != (undefined8 *)(lVar7 + in_RDX[1] * 8); lVar5 = lVar5 + 8) {
        *(undefined8 *)((long)&(result.ptr)->type + lVar5) = *puVar1;
        lVar7 = *in_RDX;
      }
      result.size_ = lVar5 >> 3;
      result.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      continuationTracePtr = (void *)0x0;
      pQStack_c0 = (QueuedClient *)0x0;
      local_b8 = (PipelineOp *)0x0;
      kj::ArrayBuilder<capnp::PipelineOp>::dispose
                ((ArrayBuilder<capnp::PipelineOp> *)&continuationTracePtr);
      continuationTracePtr =
           kj::_::
           SimpleTransformPromiseNode<kj::Own<capnp::PipelineHook,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:501:17)>
           ::anon_class_24_1_ba1d6a12_for_func::operator();
      pPVar3 = ((local_f8.ptr)->super_PromiseArenaMember).arena;
      if (pPVar3 == (PromiseArena *)0x0 || (ulong)((long)local_f8.ptr - (long)pPVar3) < 0x38) {
        pvVar4 = operator_new(0x400);
        location.node.ptr = (OwnPromiseNode)((long)pvVar4 + 0x3c8);
        kj::operator()((SimpleTransformPromiseNode<kj::Own<capnp::PipelineHook,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_c__:501:17)>
                        *)location.node.ptr,&stack0xffffffffffffff08,
                       (anon_class_24_1_ba1d6a12_for_func *)&result,&continuationTracePtr);
        *(void **)((long)pvVar4 + 0x3d0) = pvVar4;
      }
      else {
        ((local_f8.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
        location.node.ptr = (OwnPromiseNode)&local_f8.ptr[-4].super_PromiseArenaMember.arena;
        kj::operator()((SimpleTransformPromiseNode<kj::Own<capnp::PipelineHook,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_c__:501:17)>
                        *)location.node.ptr,&stack0xffffffffffffff08,
                       (anon_class_24_1_ba1d6a12_for_func *)&result,&continuationTracePtr);
        local_f8.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar3;
      }
      local_e8.ptr = (PromiseNode *)0x0;
      local_48.ptr = (PromiseNode *)0x0;
      clientPromise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)location.node.ptr;
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_48);
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_e8);
      kj::Array<capnp::PipelineOp>::~Array(&result);
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&stack0xffffffffffffff08);
      local_70.key.ptr = (PipelineOp *)*in_RDX;
      local_70.key.size_ = in_RDX[1];
      local_70.key.disposer = (ArrayDisposer *)in_RDX[2];
      *in_RDX = 0;
      in_RDX[1] = 0;
      kj::refcounted<capnp::QueuedClient,kj::Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>>>
                ((kj *)&continuationTracePtr,&clientPromise);
      local_70.value.disposer = (Disposer *)continuationTracePtr;
      local_70.value.ptr = &pQStack_c0->super_ClientHook;
      pQStack_c0 = (QueuedClient *)0x0;
      kj::Own<capnp::QueuedClient,_std::nullptr_t>::dispose
                ((Own<capnp::QueuedClient,_std::nullptr_t> *)&continuationTracePtr);
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&clientPromise);
      pEVar8 = kj::
               Vector<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Entry>
               ::
               add<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Entry>
                         ((Vector<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Entry>
                           *)this_00,&local_70);
      kj::HashMap<kj::Array<capnp::PipelineOp>,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Entry
      ::~Entry(&local_70);
      success = true;
      kj::_::
      Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:615:7)>
      ::~Deferred(&local_98);
    }
    (*((pEVar8->value).ptr)->_vptr_ClientHook[4])(this);
    pCVar6 = extraout_RDX_00;
  }
  else {
    (**(code **)((long)*ops[2].ptr + 0x10))(this);
    pCVar6 = extraout_RDX;
  }
  OVar9.ptr = pCVar6;
  OVar9.disposer = (Disposer *)this;
  return OVar9;
}

Assistant:

kj::Own<ClientHook> QueuedPipeline::getPipelinedCap(kj::Array<PipelineOp>&& ops) {
  KJ_IF_SOME(r, redirect) {
    return r->getPipelinedCap(kj::mv(ops));
  } else {
    return clientMap.findOrCreate(ops.asPtr(), [&]() {
      auto clientPromise = promise.addBranch()
          .then([ops = KJ_MAP(op, ops) { return op; }](kj::Own<PipelineHook> pipeline) {
        return pipeline->getPipelinedCap(kj::mv(ops));
      });
      return kj::HashMap<kj::Array<PipelineOp>, kj::Own<ClientHook>>::Entry {
        kj::mv(ops), kj::refcounted<QueuedClient>(kj::mv(clientPromise))
      };
    })->addRef();
  }
}